

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O3

void shtest(void)

{
  double *season;
  double local_128;
  double x [32];
  int f;
  
  memcpy(&local_128,&DAT_00157850,0x100);
  x[0x1f]._4_4_ = 2;
  season = (double *)malloc(8);
  SHtest(&local_128,0x20,(int *)((long)x + 0xfc),1,season);
  printf("stat %g Differencing Term %d \n",(ulong)(0.64 < *season));
  free(season);
  return;
}

Assistant:

void shtest() {
	int N = 32;
	int differencing_term,Nseas;
	double crit;
	double *season;
	double x[32] = {-50, 175, 149, 214, 247, 237, 225, 329, 729, 809,
       530, 489, 540, 457, 195, 176, 337, 239, 128, 102, 232, 429, 3,
       98, 43, -141, -77, -13, 125, 361, -45, 184};
	
	int i;
	int f = 2;
	
	Nseas = 1;
	crit = 0.64;

	season = (double*) malloc(sizeof(double)*Nseas);

	SHtest(x,N,&f,Nseas,season);

	differencing_term = *season > crit ? 1 : 0;

	printf("stat %g Differencing Term %d \n",*season,differencing_term);

	free(season);
}